

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SetPendingDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,PendingOperationalDataset *aPendingDataset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  Error local_788;
  ErrorCode local_760;
  anon_class_1_0_00000001 local_75a;
  v10 local_759;
  v10 *local_758;
  size_t local_750;
  string local_748;
  allocator local_721;
  string local_720;
  ResponseHandler local_700;
  ErrorCode local_6dc;
  Error local_6d8;
  ErrorCode local_6ac;
  Error local_6a8;
  ErrorCode local_67c;
  Tlv local_678;
  Error local_658;
  ErrorCode local_630;
  allocator local_629;
  string local_628;
  Error local_608;
  anon_class_1_0_00000001 local_5da;
  v10 local_5d9;
  v10 *local_5d8;
  size_t local_5d0;
  string local_5c8;
  Error local_5a8;
  anon_class_1_0_00000001 local_57a;
  v10 local_579;
  v10 *local_578;
  size_t local_570;
  string local_568;
  Error local_548;
  anon_class_1_0_00000001 local_51a;
  v10 local_519;
  v10 *local_518;
  size_t local_510;
  string local_508;
  Error local_4e8;
  anon_class_1_0_00000001 local_4ba;
  v10 local_4b9;
  v10 *local_4b8;
  size_t local_4b0;
  string local_4a8;
  Error local_488;
  undefined1 local_460 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_430 [8];
  Request request;
  Error error;
  PendingOperationalDataset *aPendingDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_350 [16];
  v10 *local_340;
  ulong local_338;
  v10 *local_330;
  size_t sStack_328;
  string *local_320;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_318 [3];
  undefined1 local_300 [16];
  v10 *local_2f0;
  ulong local_2e8;
  v10 *local_2e0;
  size_t sStack_2d8;
  string *local_2d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_2c8 [3];
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  ulong local_298;
  v10 *local_290;
  size_t sStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  ulong local_248;
  v10 *local_240;
  size_t sStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_228 [2];
  undefined1 local_218 [16];
  v10 *local_208;
  ulong local_200;
  v10 *local_1f8;
  size_t sStack_1f0;
  string *local_1e8;
  v10 *local_1e0;
  v10 **local_1d8;
  v10 *local_1d0;
  v10 **local_1c8;
  v10 *local_1c0;
  v10 **local_1b8;
  v10 *local_1b0;
  v10 **local_1a8;
  v10 *local_1a0;
  v10 **local_198;
  v10 **local_190;
  v10 *local_188;
  size_t sStack_180;
  v10 **local_170;
  v10 *local_168;
  size_t sStack_160;
  v10 **local_150;
  v10 *local_148;
  size_t sStack_140;
  v10 **local_130;
  v10 *local_128;
  size_t sStack_120;
  v10 **local_110;
  v10 *local_108;
  size_t sStack_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined1 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  undefined8 local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  CommissionerImpl **local_58;
  undefined1 *local_50;
  CommissionerImpl **local_48;
  undefined8 local_40;
  undefined1 *local_38;
  CommissionerImpl **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_430,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_460,aHandler);
  if (((aPendingDataset->super_ActiveOperationalDataset).mPresentFlags & 0x8000) == 0) {
    SetPendingDataset::anon_class_1_0_00000001::operator()(&local_4ba);
    local_1d8 = &local_4b8;
    local_1e0 = &local_4b9;
    bVar5 = ::fmt::v10::operator()(local_1e0);
    local_4b0 = bVar5.size_;
    local_4b8 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_1e8 = &local_4a8;
    local_1f8 = local_4b8;
    sStack_1f0 = local_4b0;
    local_190 = &local_1f8;
    local_208 = local_4b8;
    local_200 = local_4b0;
    local_188 = local_208;
    sStack_180 = local_200;
    local_228[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_f0 = local_218;
    local_f8 = local_228;
    local_e0 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_f8;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_200;
    local_e8 = local_f8;
    local_d8 = local_f0;
    local_10 = local_f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_4a8,local_208,fmt,args);
    Error::Error(&local_488,kInvalidArgs,&local_4a8);
    Error::operator=((Error *)&request.mEndpoint,&local_488);
    Error::~Error(&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
  }
  else if (((aPendingDataset->super_ActiveOperationalDataset).mPresentFlags & 0x10) == 0) {
    SetPendingDataset::anon_class_1_0_00000001::operator()(&local_51a);
    local_1c8 = &local_518;
    local_1d0 = &local_519;
    bVar5 = ::fmt::v10::operator()(local_1d0);
    local_510 = bVar5.size_;
    local_518 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_230 = &local_508;
    local_240 = local_518;
    sStack_238 = local_510;
    local_170 = &local_240;
    local_250 = local_518;
    local_248 = local_510;
    local_168 = local_250;
    sStack_160 = local_248;
    local_278[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c8 = local_260;
    local_d0 = local_278;
    local_b8 = 0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_d0;
    fmt_00.size_ = 0;
    fmt_00.data_ = (char *)local_248;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_18 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_508,local_250,fmt_00,args_00);
    Error::Error(&local_4e8,kInvalidArgs,&local_508);
    Error::operator=((Error *)&request.mEndpoint,&local_4e8);
    Error::~Error(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
  }
  else if (((aPendingDataset->super_ActiveOperationalDataset).mPresentFlags & 0x20) == 0) {
    SetPendingDataset::anon_class_1_0_00000001::operator()(&local_57a);
    local_1b8 = &local_578;
    local_1c0 = &local_579;
    bVar5 = ::fmt::v10::operator()(local_1c0);
    local_570 = bVar5.size_;
    local_578 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_280 = &local_568;
    local_290 = local_578;
    sStack_288 = local_570;
    local_150 = &local_290;
    local_2a0 = local_578;
    local_298 = local_570;
    local_148 = local_2a0;
    sStack_140 = local_298;
    local_2c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_a0 = local_2b0;
    local_a8 = local_2c8;
    local_90 = 0;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_a8;
    fmt_01.size_ = 0;
    fmt_01.data_ = (char *)local_298;
    local_98 = local_a8;
    local_88 = local_a0;
    local_20 = local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_568,local_2a0,fmt_01,args_01);
    Error::Error(&local_548,kInvalidArgs,&local_568);
    Error::operator=((Error *)&request.mEndpoint,&local_548);
    Error::~Error(&local_548);
    std::__cxx11::string::~string((string *)&local_568);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
    if ((uVar2 & 1) == 0) {
      SetPendingDataset::anon_class_1_0_00000001::operator()(&local_5da);
      local_1a8 = &local_5d8;
      local_1b0 = &local_5d9;
      bVar5 = ::fmt::v10::operator()(local_1b0);
      local_5d0 = bVar5.size_;
      local_5d8 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_2d0 = &local_5c8;
      local_2e0 = local_5d8;
      sStack_2d8 = local_5d0;
      local_130 = &local_2e0;
      local_2f0 = local_5d8;
      local_2e8 = local_5d0;
      local_128 = local_2f0;
      sStack_120 = local_2e8;
      local_318[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_78 = local_300;
      local_80 = local_318;
      local_68 = 0;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_80;
      fmt_02.size_ = 0;
      fmt_02.data_ = (char *)local_2e8;
      local_70 = local_80;
      local_60 = local_78;
      local_28 = local_80;
      ::fmt::v10::vformat_abi_cxx11_(&local_5c8,local_2f0,fmt_02,args_02);
      Error::Error(&local_5a8,kInvalidState,&local_5c8);
      Error::operator=((Error *)&request.mEndpoint,&local_5a8);
      Error::~Error(&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_628,"/c/ps",&local_629);
      coap::Message::SetUriPath(&local_608,(Message *)local_430,&local_628);
      pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_608);
      local_630 = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_630);
      Error::~Error(&local_608);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator((allocator<char> *)&local_629);
      if (!bVar1) {
        iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv(&local_678,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
        AppendTlv(&local_658,(Message *)local_430,&local_678);
        pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_658);
        local_67c = kNone;
        bVar1 = commissioner::operator!=(pEVar4,&local_67c);
        Error::~Error(&local_658);
        tlv::Tlv::~Tlv(&local_678);
        if (!bVar1) {
          EncodePendingOperationalDataset(&local_6a8,(Request *)local_430,aPendingDataset);
          pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_6a8);
          local_6ac = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_6ac);
          Error::~Error(&local_6a8);
          if (!bVar1) {
            uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
            if ((uVar2 & 1) != 0) {
              SignRequest(&local_6d8,this,(Request *)local_430,kMeshCoP,true);
              pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_6d8);
              local_6dc = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_6dc);
              Error::~Error(&local_6d8);
              if (bVar1) goto LAB_001b745c;
            }
            std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
            function<ot::commissioner::CommissionerImpl::SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)::__2&,void>
                      ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                        *)&local_700,(anon_class_32_1_d0c21527 *)local_460);
            ProxyClient::SendRequest
                      (&this->mProxyClient,(Request *)local_430,&local_700,0xfc00,0xf0bf);
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            ~function(&local_700);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_720,"mgmt",&local_721);
            SetPendingDataset::anon_class_1_0_00000001::operator()(&local_75a);
            local_198 = &local_758;
            local_1a0 = &local_759;
            bVar5 = ::fmt::v10::operator()(local_1a0);
            local_750 = bVar5.size_;
            local_758 = (v10 *)bVar5.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_320 = &local_748;
            local_330 = local_758;
            sStack_328 = local_750;
            local_110 = &local_330;
            local_340 = local_758;
            local_338 = local_750;
            local_108 = local_340;
            sStack_100 = local_338;
            this_local = (CommissionerImpl *)
                         ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
            ;
            local_50 = local_350;
            local_58 = &this_local;
            local_40 = 0;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)local_58;
            fmt_03.size_ = 0;
            fmt_03.data_ = (char *)local_338;
            local_48 = local_58;
            local_38 = local_50;
            local_30 = local_58;
            ::fmt::v10::vformat_abi_cxx11_(&local_748,local_340,fmt_03,args_03);
            Log(kDebug,&local_720,&local_748);
            std::__cxx11::string::~string((string *)&local_748);
            std::__cxx11::string::~string((string *)&local_720);
            std::allocator<char>::~allocator((allocator<char> *)&local_721);
          }
        }
      }
    }
  }
LAB_001b745c:
  local_760 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_760);
  if (bVar1) {
    Error::Error(&local_788,(Error *)&request.mEndpoint);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_788);
    Error::~Error(&local_788);
  }
  SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)
  ::$_2::~__2((__2 *)local_460);
  coap::Message::~Message((Message *)local_430);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::SetPendingDataset(ErrorHandler aHandler, const PendingOperationalDataset &aPendingDataset)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(aPendingDataset.mPresentFlags & PendingOperationalDataset::kActiveTimestampBit,
                 error = ERROR_INVALID_ARGS("Active Timestamp is mandatory for a Pending Operational Dataset"));

    VerifyOrExit(aPendingDataset.mPresentFlags & PendingOperationalDataset::kPendingTimestampBit,
                 error = ERROR_INVALID_ARGS("Pending Timestamp is mandatory for a Pending Operational Dataset"));
    VerifyOrExit(aPendingDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit,
                 error = ERROR_INVALID_ARGS("Delay Timer is mandatory for a Pending Operational Dataset"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtPendingSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodePendingOperationalDataset(request, aPendingDataset));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_PENDING_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}